

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbWrite(sqlite3_file *pFile,void *z,int iAmt,sqlite_int64 iOfst)

{
  int iVar1;
  MemStore *in_RCX;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  int rc;
  MemStore *p;
  long *newSz;
  int local_4;
  
  newSz = *(long **)(in_RDI + 8);
  memdbEnter((MemStore *)0x157ec3);
  if ((*(uint *)((long)newSz + 0x2c) & 4) == 0) {
    if (*newSz < (long)&in_RCX->sz + (long)in_EDX) {
      if ((newSz[1] < (long)&in_RCX->sz + (long)in_EDX) &&
         (iVar1 = memdbEnlarge(in_RCX,(sqlite3_int64)newSz), iVar1 != 0)) {
        memdbLeave((MemStore *)0x157f4f);
        return iVar1;
      }
      if (*newSz < (long)in_RCX) {
        memset((void *)(newSz[3] + *newSz),0,(long)in_RCX - *newSz);
      }
      *newSz = (long)&in_RCX->sz + (long)in_EDX;
    }
    memcpy((void *)((long)&in_RCX->sz + newSz[3]),in_RSI,(long)in_EDX);
    memdbLeave((MemStore *)0x157fc9);
    local_4 = 0;
  }
  else {
    memdbLeave((MemStore *)0x157edd);
    local_4 = 0x30a;
  }
  return local_4;
}

Assistant:

static int memdbWrite(
  sqlite3_file *pFile,
  const void *z,
  int iAmt,
  sqlite_int64 iOfst
){
  MemStore *p = ((MemFile*)pFile)->pStore;
  memdbEnter(p);
  if( NEVER(p->mFlags & SQLITE_DESERIALIZE_READONLY) ){
    /* Can't happen: memdbLock() will return SQLITE_READONLY before
    ** reaching this point */
    memdbLeave(p);
    return SQLITE_IOERR_WRITE;
  }
  if( iOfst+iAmt>p->sz ){
    int rc;
    if( iOfst+iAmt>p->szAlloc
     && (rc = memdbEnlarge(p, iOfst+iAmt))!=SQLITE_OK
    ){
      memdbLeave(p);
      return rc;
    }
    if( iOfst>p->sz ) memset(p->aData+p->sz, 0, iOfst-p->sz);
    p->sz = iOfst+iAmt;
  }
  memcpy(p->aData+iOfst, z, iAmt);
  memdbLeave(p);
  return SQLITE_OK;
}